

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

mp_int * monty_invert(MontyContext *mc,mp_int *x)

{
  mp_int *pmVar1;
  mp_int *a_coeff_out;
  mp_int *r;
  
  pmVar1 = mc->m;
  a_coeff_out = mp_make_sized(pmVar1->nw);
  mp_bezout_into(a_coeff_out,(mp_int *)0x0,(mp_int *)0x0,x,pmVar1);
  pmVar1 = mc->powers_of_r_mod_m[2];
  r = mp_make_sized(mc->rw);
  monty_mul_into(mc,r,a_coeff_out,pmVar1);
  mp_free(a_coeff_out);
  return r;
}

Assistant:

mp_int *monty_invert(MontyContext *mc, mp_int *x)
{
    /* Given xr, we want to return x^{-1}r = (xr)^{-1} r^2 =
     * monty_reduce((xr)^{-1} r^3) */
    mp_int *tmp = mp_invert(x, mc->m);
    mp_int *toret = monty_mul(mc, tmp, mc->powers_of_r_mod_m[2]);
    mp_free(tmp);
    return toret;
}